

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testSize<double>(char *type)

{
  ostream *poVar1;
  char *in_RDI;
  double dVar2;
  Interval<double> b_1;
  double max;
  double min;
  Interval<double> b1;
  double p;
  Interval<double> b0;
  Interval<double> b;
  Interval<double> *in_stack_ffffffffffffff88;
  double local_68;
  double local_60;
  double local_58;
  Interval<double> local_50;
  double local_40;
  double local_38;
  double local_30;
  Interval<double> local_28 [2];
  char *local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"    size() for type ");
  poVar1 = std::operator<<(poVar1,local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x16e5b2);
  dVar2 = Imath_3_2::Interval<double>::size(in_stack_ffffffffffffff88);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("b.size () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x1dc,"void (anonymous namespace)::testSize(const char *) [T = double]");
  }
  local_30 = -1.0;
  local_38 = 1.0;
  Imath_3_2::Interval<double>::Interval(local_28,&local_30,&local_38);
  dVar2 = Imath_3_2::Interval<double>::size(in_stack_ffffffffffffff88);
  if ((dVar2 != 2.0) || (NAN(dVar2))) {
    __assert_fail("b0.size () == T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x1e4,"void (anonymous namespace)::testSize(const char *) [T = double]");
  }
  local_40 = 42.0;
  local_58 = -42.0;
  Imath_3_2::Interval<double>::Interval(&local_50,&local_58,&local_40);
  dVar2 = Imath_3_2::Interval<double>::size(in_stack_ffffffffffffff88);
  if ((dVar2 != local_40 * 2.0) || (NAN(dVar2) || NAN(local_40 * 2.0))) {
    __assert_fail("b1.size () == p * T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x1e9,"void (anonymous namespace)::testSize(const char *) [T = double]");
  }
  local_60 = 0.0;
  local_68 = 1.0;
  Imath_3_2::Interval<double>::Interval
            ((Interval<double> *)&stack0xffffffffffffff88,&local_60,&local_68);
  dVar2 = Imath_3_2::Interval<double>::size(in_stack_ffffffffffffff88);
  if ((dVar2 == local_68) && (!NAN(dVar2) && !NAN(local_68))) {
    return;
  }
  __assert_fail("b.size () == max",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                ,0x1f5,"void (anonymous namespace)::testSize(const char *) [T = double]");
}

Assistant:

void
testSize (const char* type)
{
    cout << "    size() for type " << type << endl;

    //
    // Size of empty interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (b.size () == T (0));
    }

    //
    // Size of non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (b0.size () == T (2));

        T p (42);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (-p, p);
        assert (b1.size () == p * T (2));
    }

    //
    // Size of non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);

        assert (b.size () == max);
    }
}